

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f *
Matrix4f::orthographicProjection(float width,float height,float zNear,float zFar,bool directX)

{
  float *pfVar1;
  byte in_SIL;
  Matrix4f *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  Matrix4f *m;
  
  Matrix4f(in_RDI,0.0);
  pfVar1 = operator()(in_RDI,0,0);
  *pfVar1 = 2.0 / in_XMM0_Da;
  pfVar1 = operator()(in_RDI,1,1);
  *pfVar1 = 2.0 / in_XMM1_Da;
  pfVar1 = operator()(in_RDI,3,3);
  *pfVar1 = 1.0;
  pfVar1 = operator()(in_RDI,0,3);
  *pfVar1 = -1.0;
  pfVar1 = operator()(in_RDI,1,3);
  *pfVar1 = -1.0;
  if ((in_SIL & 1) == 0) {
    pfVar1 = operator()(in_RDI,2,2);
    *pfVar1 = 2.0 / (in_XMM2_Da - in_XMM3_Da);
    pfVar1 = operator()(in_RDI,2,3);
    *pfVar1 = (in_XMM2_Da + in_XMM3_Da) / (in_XMM2_Da - in_XMM3_Da);
  }
  else {
    pfVar1 = operator()(in_RDI,2,2);
    *pfVar1 = 1.0 / (in_XMM2_Da - in_XMM3_Da);
    pfVar1 = operator()(in_RDI,2,3);
    *pfVar1 = in_XMM2_Da / (in_XMM2_Da - in_XMM3_Da);
  }
  return in_RDI;
}

Assistant:

Matrix4f Matrix4f::orthographicProjection( float width, float height, float zNear, float zFar, bool directX )
{
	Matrix4f m;

	m( 0, 0 ) = 2.0f / width;
	m( 1, 1 ) = 2.0f / height;
	m( 3, 3 ) = 1.0f;

	m( 0, 3 ) = -1;
	m( 1, 3 ) = -1;

	if( directX )
	{
		m( 2, 2 ) = 1.0f / ( zNear - zFar );
		m( 2, 3 ) = zNear / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = 2.0f / ( zNear - zFar );
		m( 2, 3 ) = ( zNear + zFar ) / ( zNear - zFar );
	}

	return m;
}